

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

vector<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_> * __thiscall
embree::XMLLoader::loadVec3iArray(XMLLoader *this,Ref<embree::XML> *xml)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  runtime_error *this_00;
  long *in_RDX;
  vector<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_> *in_RDI;
  size_t i;
  XMLLoader *in_stack_000000b0;
  vector<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_> *data;
  char *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe38;
  size_type in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  string *in_stack_fffffffffffffe70;
  XML *in_stack_fffffffffffffe78;
  Token *this_01;
  int local_148;
  int local_144;
  int local_140;
  int local_13c;
  int local_138;
  int local_134;
  ulong local_130;
  undefined7 in_stack_fffffffffffffed8;
  undefined1 uVar5;
  string local_100 [35];
  undefined1 local_dd;
  allocator local_c9;
  string local_c8 [32];
  string local_a8 [32];
  long *local_88;
  long *local_70;
  long *local_68;
  long *local_60;
  long *local_58;
  long *local_50;
  long *local_48;
  int *local_38;
  int *local_30;
  int *local_28;
  int *local_20;
  int *local_10;
  reference local_8;
  
  if (*in_RDX == 0) {
    memset(in_RDI,0,0x18);
    std::vector<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_>::vector
              ((vector<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_> *)0x37e278);
  }
  else {
    local_88 = in_RDX;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"ofs",&local_c9);
    XML::parm(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                            in_stack_fffffffffffffe28);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    if (bVar2) {
      loadBinary<std::vector<embree::Vec3<int>,std::allocator<embree::Vec3<int>>>>
                (in_stack_000000b0,(Ref<embree::XML> *)i);
    }
    else {
      local_dd = 0;
      std::vector<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_>::vector
                ((vector<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_> *)0x37e3d1);
      local_48 = local_88;
      this_01 = (Token *)*local_88;
      sVar4 = std::vector<embree::Token,_std::allocator<embree::Token>_>::size
                        ((vector<embree::Token,_std::allocator<embree::Token>_> *)&this_01[2].str);
      if (sVar4 % 3 != 0) {
        uVar5 = 1;
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_50 = local_88;
        ParseLocation::str_abi_cxx11_((ParseLocation *)CONCAT17(uVar5,in_stack_fffffffffffffed8));
        std::operator+(in_stack_fffffffffffffe38,
                       (char *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
        std::runtime_error::runtime_error(this_00,local_100);
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_58 = local_88;
      std::vector<embree::Token,_std::allocator<embree::Token>_>::size
                ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_88 + 0x98));
      std::vector<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_>::resize
                ((vector<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_> *)
                 CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 in_stack_fffffffffffffe48);
      for (local_130 = 0; uVar1 = local_130,
          sVar4 = std::vector<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_>::size(in_RDI),
          uVar1 < sVar4; local_130 = local_130 + 1) {
        local_60 = local_88;
        std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
                  ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_88 + 0x98),
                   local_130 * 3);
        local_140 = Token::Int(this_01);
        local_68 = local_88;
        std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
                  ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_88 + 0x98),
                   local_130 * 3 + 1);
        local_144 = Token::Int(this_01);
        local_70 = local_88;
        std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
                  ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_88 + 0x98),
                   local_130 * 3 + 2);
        iVar3 = Token::Int(this_01);
        local_20 = &local_13c;
        local_28 = &local_140;
        local_30 = &local_144;
        local_38 = &local_148;
        local_13c = local_140;
        local_138 = local_144;
        local_134 = local_148;
        local_148 = iVar3;
        local_8 = std::vector<embree::Vec3<int>,_std::allocator<embree::Vec3<int>_>_>::operator[]
                            (in_RDI,local_130);
        local_10 = &local_13c;
        (local_8->field_0).field_0.x = local_13c;
        (local_8->field_0).field_0.y = local_138;
        (local_8->field_0).field_0.z = local_134;
      }
    }
  }
  return in_RDI;
}

Assistant:

std::vector<Vec3i> XMLLoader::loadVec3iArray(const Ref<XML>& xml)
  {
    if (!xml) return std::vector<Vec3i>();

    if (xml->parm("ofs") != "") {
      return loadBinary<std::vector<Vec3i>>(xml);
    } 
    else 
    {
      std::vector<Vec3i> data;
      if (xml->body.size() % 3 != 0) THROW_RUNTIME_ERROR(xml->loc.str()+": wrong vector<int3> body");
      data.resize(xml->body.size()/3);
      for (size_t i=0; i<data.size(); i++) 
        data[i] = Vec3i(xml->body[3*i+0].Int(),xml->body[3*i+1].Int(),xml->body[3*i+2].Int());
      return data;
    }
  }